

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

bool __thiscall cmRST::ProcessInclude(cmRST *this,string *file,IncludeType type)

{
  ostream *os;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  string local_e30;
  undefined1 local_e10 [8];
  cmRST r;
  bool found;
  IncludeType type_local;
  string *file_local;
  cmRST *this_local;
  
  r.ReplaceName.field_2._M_local_buf[0xb] = '\0';
  if (this->IncludeDepth < 10) {
    os = this->OS;
    r.ReplaceName.field_2._12_4_ = type;
    std::__cxx11::string::string((string *)&local_e30,(string *)&this->DocRoot);
    cmRST((cmRST *)local_e10,os,&local_e30);
    std::__cxx11::string::~string((string *)&local_e30);
    r.DocRoot.field_2._8_4_ = this->IncludeDepth + 1;
    r.DocRoot.field_2._M_local_buf[0xc] = this->OutputLinePending & 1;
    if (r.ReplaceName.field_2._12_4_ != 2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&r.DocDir.field_2 + 8),&this->Replace);
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)file);
    if (*pcVar1 == '/') {
      std::operator+(&local_e60,&this->DocRoot,file);
      std::__cxx11::string::operator=((string *)file,(string *)&local_e60);
      std::__cxx11::string::~string((string *)&local_e60);
    }
    else {
      std::operator+(&local_ea0,&this->DocDir,"/");
      std::operator+(&local_e80,&local_ea0,file);
      std::__cxx11::string::operator=((string *)file,(string *)&local_e80);
      std::__cxx11::string::~string((string *)&local_e80);
      std::__cxx11::string::~string((string *)&local_ea0);
    }
    r.ReplaceName.field_2._M_local_buf[0xb] =
         ProcessFile((cmRST *)local_e10,file,r.ReplaceName.field_2._12_4_ == 1);
    if (r.ReplaceName.field_2._12_4_ != 2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&this->Replace,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&r.DocDir.field_2 + 8));
    }
    this->OutputLinePending = (bool)(r.DocRoot.field_2._M_local_buf[0xc] & 1);
    ~cmRST((cmRST *)local_e10);
  }
  return (bool)(r.ReplaceName.field_2._M_local_buf[0xb] & 1);
}

Assistant:

bool cmRST::ProcessInclude(std::string file, IncludeType type)
{
  bool found = false;
  if (this->IncludeDepth < 10) {
    cmRST r(this->OS, this->DocRoot);
    r.IncludeDepth = this->IncludeDepth + 1;
    r.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      r.Replace = this->Replace;
    }
    if (file[0] == '/') {
      file = this->DocRoot + file;
    } else {
      file = this->DocDir + "/" + file;
    }
    found = r.ProcessFile(file, type == IncludeModule);
    if (type != IncludeTocTree) {
      this->Replace = r.Replace;
    }
    this->OutputLinePending = r.OutputLinePending;
  }
  return found;
}